

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O1

void print_count_report(ostream *out)

{
  ostream *poVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Statistics:",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," sync_bad_count =",0x11);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,sync_bad_count);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," async_bad_count =",0x12);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,async_bad_count);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," count_timeouts =",0x11);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,count_timeouts);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," above 15 =",0xb);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,above_3to);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," below 10 =",0xb);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,below_2to);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," eof =",6);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void print_count_report(std::ostream &out)
{
	out 	<< "Statistics:" << std::endl
		<< " sync_bad_count =" << sync_bad_count << std::endl
		<< " async_bad_count =" << async_bad_count << std::endl
		<< " count_timeouts =" << count_timeouts << std::endl
		<< " above 15 =" << above_3to << std::endl
		<< " below 10 =" << below_2to << std::endl
		<< " eof =" << eof_detected << std::endl;
}